

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointObjectAppearance.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::PointObjectAppearance::Decode(PointObjectAppearance *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,(uint *)&(this->super_ObjectAppearance).field_0xc);
    KDataStream::Read<unsigned_short>
              (stream,&(this->super_ObjectAppearance).m_GeneralAppearanceUnion.
                       m_ui16GeneralAppearance);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void PointObjectAppearance::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < POINT_OBJECT_APPEARANCE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_SpecificAppearanceUnion.m_ui32SpecificAppearance
           >> m_GeneralAppearanceUnion.m_ui16GeneralAppearance;
}